

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptMap.cpp
# Opt level: O0

Var Js::JavascriptMap::EntryDelete(RecyclableObject *function,CallInfo callInfo,...)

{
  code *pcVar1;
  bool bVar2;
  int n;
  ScriptContext *pSVar3;
  ThreadContext *this;
  Var *values;
  undefined4 *puVar4;
  JavascriptLibrary *pJVar5;
  JavascriptBoolean *pJVar6;
  RecyclableObject *local_88;
  JavascriptMap *local_80;
  bool didDelete;
  Var key;
  JavascriptMap *map;
  ScriptContext *scriptContext;
  ArgumentReader args;
  Var *_argsVarArray;
  RecyclableObject *function_local;
  CallInfo callInfo_local;
  
  function_local = (RecyclableObject *)callInfo;
  pSVar3 = RecyclableObject::GetScriptContext(function);
  this = ScriptContext::GetThreadContext(pSVar3);
  pSVar3 = RecyclableObject::GetScriptContext(function);
  ThreadContext::ProbeStack(this,0xc00,pSVar3,(PVOID)0x0);
  n = _count_args((CallInfo)function_local);
  values = _get_va(&stack0x00000000,n);
  args.super_Arguments.Values = (Type)function_local;
  bVar2 = CallInfo::operator==((CallInfo *)(values + -1),(CallInfo)function_local);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptMap.cpp"
                                ,0x86,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  ArgumentReader::ArgumentReader
            ((ArgumentReader *)&scriptContext,(CallInfo *)&function_local,values);
  pSVar3 = RecyclableObject::GetScriptContext(function);
  callInfo_local = (CallInfo)Arguments::operator[]((Arguments *)&scriptContext,0);
  bVar2 = VarIs<Js::JavascriptMap>((Var)callInfo_local);
  if (bVar2) {
    local_80 = UnsafeVarTo<Js::JavascriptMap>((Var)callInfo_local);
  }
  else {
    local_80 = (JavascriptMap *)0x0;
  }
  if (local_80 == (JavascriptMap *)0x0) {
    JavascriptError::ThrowTypeErrorVar(pSVar3,-0x7ff5ec04,L"Map.prototype.delete",L"Map");
  }
  if (((uint)scriptContext & 0xffffff) == 1 || ((ulong)scriptContext & 0xffffff) == 0) {
    pJVar5 = ScriptContext::GetLibrary(pSVar3);
    local_88 = JavascriptLibraryBase::GetUndefined(&pJVar5->super_JavascriptLibraryBase);
  }
  else {
    local_88 = (RecyclableObject *)Arguments::operator[]((Arguments *)&scriptContext,1);
  }
  bVar2 = Delete(local_80,local_88);
  pJVar5 = ScriptContext::GetLibrary(pSVar3);
  pJVar6 = JavascriptLibrary::CreateBoolean(pJVar5,(uint)bVar2);
  return pJVar6;
}

Assistant:

Var JavascriptMap::EntryDelete(RecyclableObject* function, CallInfo callInfo, ...)
{
    PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

    ARGUMENTS(args, callInfo);
    ScriptContext* scriptContext = function->GetScriptContext();

    JavascriptMap* map = JavascriptOperators::TryFromVar<JavascriptMap>(args[0]);
    if (map == nullptr)
    {
        JavascriptError::ThrowTypeErrorVar(scriptContext, JSERR_NeedObjectOfType, _u("Map.prototype.delete"), _u("Map"));
    }

    Var key = (args.Info.Count > 1) ? args[1] : scriptContext->GetLibrary()->GetUndefined();

    bool didDelete = map->Delete(key);

    return scriptContext->GetLibrary()->CreateBoolean(didDelete);
}